

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O2

void change_frequency(OPL_DATA_conflict *chip,Bitu chanbase,Bitu regbase,op_type_conflict *op_pt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  double dVar5;
  
  bVar4 = chip->adlibreg[chanbase + 0xb0];
  uVar1 = (uint)chip->adlibreg[chanbase + 0xa0] | (bVar4 & 3) << 8;
  op_pt->freq_high = uVar1 >> 7;
  uVar3 = *(uint *)(chip->adlibreg + 8) >> 6 & 1;
  uVar2 = bVar4 >> 2 & 7;
  uVar3 = (uVar3 & bVar4 | (uVar3 ^ 1) & (uint)(bVar4 >> 1)) + uVar2 * 2;
  op_pt->toff = uVar3;
  bVar4 = chip->adlibreg[(ulong)regbase + 0x20];
  if ((bVar4 & 0x10) == 0) {
    op_pt->toff = uVar3 >> 2;
    bVar4 = chip->adlibreg[(ulong)regbase + 0x20];
  }
  op_pt->tinc = (Bit32u)(long)((double)(int)(uVar1 << (sbyte)uVar2) * chip->frqmul[bVar4 & 0xf]);
  dVar5 = exp2(((double)kslev[0][(ulong)(uVar1 >> 6) + (ulong)(uVar2 << 4)] *
                kslmul[chip->adlibreg[(ulong)regbase + 0x40] >> 6] +
               (double)(chip->adlibreg[(ulong)regbase + 0x40] & 0x3f)) * -0.125 + -14.0);
  op_pt->vol = dVar5;
  change_attackrate(chip,regbase,op_pt);
  change_decayrate(chip,regbase,op_pt);
  change_releaserate(chip,regbase,op_pt);
  return;
}

Assistant:

static void change_frequency(OPL_DATA* chip, Bitu chanbase, Bitu regbase, op_type* op_pt)
{
	Bit32u frn;
	Bit32u oct;
	Bit32u note_sel;
	fltype vol_in;
	
	// frequency
	frn = ((((Bit32u)chip->adlibreg[ARC_KON_BNUM+chanbase])&3)<<8) + (Bit32u)chip->adlibreg[ARC_FREQ_NUM+chanbase];
	// block number/octave
	oct = ((((Bit32u)chip->adlibreg[ARC_KON_BNUM+chanbase])>>2)&7);
	op_pt->freq_high = (Bit32s)((frn>>7)&7);

	// keysplit
	note_sel = (chip->adlibreg[8]>>6)&1;
	op_pt->toff = ((frn>>9)&(note_sel^1)) | ((frn>>8)&note_sel);
	op_pt->toff += (oct<<1);

	// envelope scaling (KSR)
	if (!(chip->adlibreg[ARC_TVS_KSR_MUL+regbase]&0x10)) op_pt->toff >>= 2;

	// 20+a0+b0:
	op_pt->tinc = (Bit32u)((((fltype)(frn<<oct))*chip->frqmul[chip->adlibreg[ARC_TVS_KSR_MUL+regbase]&15]));
	// 40+a0+b0:
	vol_in = (fltype)((fltype)(chip->adlibreg[ARC_KSL_OUTLEV+regbase]&63) +
							kslmul[chip->adlibreg[ARC_KSL_OUTLEV+regbase]>>6]*kslev[oct][frn>>6]);
	op_pt->vol = (fltype)(pow(FL2,(fltype)(vol_in * -0.125 - 14)));

	// operator frequency changed, care about features that depend on it
	change_attackrate(chip, regbase,op_pt);
	change_decayrate(chip, regbase,op_pt);
	change_releaserate(chip, regbase,op_pt);
}